

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

int __thiscall mkvparser::Track::Info::CopyStr(Info *this,offset_in_Info_to_unknown str,Info *dst_)

{
  char *__s;
  size_t __n;
  char *__dest;
  int iVar1;
  
  iVar1 = -1;
  if ((str != 0xffffffffffffffff) && (*(long *)((long)&dst_->type + str) == 0)) {
    __s = *(char **)((long)&this->type + str);
    if (__s != (char *)0x0) {
      __n = strlen(__s);
      __dest = SafeArrayAlloc<char>(1,__n + 1);
      *(char **)((long)&dst_->type + str) = __dest;
      if (__dest == (char *)0x0) {
        return -1;
      }
      memcpy(__dest,__s,__n);
      *(undefined1 *)(*(long *)((long)&dst_->type + str) + __n) = 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Track::Info::CopyStr(char* Info::*str, Info& dst_) const {
  if (str == static_cast<char * Info::*>(NULL))
    return -1;

  char*& dst = dst_.*str;

  if (dst)  // should be NULL already
    return -1;

  const char* const src = this->*str;

  if (src == NULL)
    return 0;

  const size_t len = strlen(src);

  dst = SafeArrayAlloc<char>(1, len + 1);

  if (dst == NULL)
    return -1;

  memcpy(dst, src, len);
  dst[len] = '\0';

  return 0;
}